

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O2

void __thiscall OpenMD::ForceField::parse(ForceField *this,string *filename)

{
  ifstrstream *input;
  ulong uVar1;
  AtomType *this_00;
  uint uVar2;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb;
  MapTypeIterator local_48;
  _Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_40;
  
  input = openForceFieldFile(this,filename);
  SectionParserManager::parse
            (&this->spMan_,&input->super_basic_istream<char,_std::char_traits<char>_>,this);
  local_48._M_node =
       (this->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_48._M_node ==
      &(this->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (AtomType *)0x0;
  }
  else {
    this_00 = *(AtomType **)(local_48._M_node + 2);
  }
  while (this_00 != (AtomType *)0x0) {
    AtomType::allYourBase
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)&local_40,this_00)
    ;
    uVar1 = (long)local_40._M_impl.super__Vector_impl_data._M_finish -
            (long)local_40._M_impl.super__Vector_impl_data._M_start >> 3;
    if (1 < uVar1) {
      uVar1 = uVar1 & 0xffffffff;
      while( true ) {
        uVar2 = (uint)(uVar1 - 1);
        if ((int)uVar2 < 1) break;
        (*local_40._M_impl.super__Vector_impl_data._M_start[uVar1 - 2]->_vptr_AtomType[2])
                  (local_40._M_impl.super__Vector_impl_data._M_start[uVar1 - 2],
                   local_40._M_impl.super__Vector_impl_data._M_start[uVar2 & 0x7fffffff]);
        uVar1 = uVar1 - 1;
      }
    }
    std::_Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~_Vector_base
              (&local_40);
    this_00 = TypeContainer<OpenMD::AtomType,_1>::nextType(&this->atomTypeCont_,&local_48);
  }
  (*(input->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[1])(input);
  return;
}

Assistant:

void ForceField::parse(const std::string& filename) {
    ifstrstream* ffStream;

    ffStream = openForceFieldFile(filename);

    spMan_.parse(*ffStream, *this);

    ForceField::AtomTypeContainer::MapTypeIterator i;
    AtomType* at;

    for (at = atomTypeCont_.beginType(i); at != NULL;
         at = atomTypeCont_.nextType(i)) {
      // useBase sets the responsibilities, and these have to be done
      // after the atomTypes and Base types have all been scanned:

      std::vector<AtomType*> ayb = at->allYourBase();
      if (ayb.size() > 1) {
        for (int j = ayb.size() - 1; j > 0; j--) {
          ayb[j - 1]->useBase(ayb[j]);
        }
      }
    }

    delete ffStream;
  }